

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O0

void __thiscall
pybind11::buffer_info::buffer_info
          (buffer_info *this,void *ptr,ssize_t itemsize,string *format,ssize_t ndim,
          any_container<long> *shape_in,any_container<long> *strides_in,bool readonly)

{
  vector<long,_std::allocator<long>_> *pvVar1;
  size_type sVar2;
  reference pvVar3;
  size_type local_58;
  size_t i;
  bool readonly_local;
  any_container<long> *shape_in_local;
  ssize_t ndim_local;
  string *format_local;
  ssize_t itemsize_local;
  void *ptr_local;
  buffer_info *this_local;
  
  this->ptr = ptr;
  this->itemsize = itemsize;
  this->size = 1;
  std::__cxx11::string::string((string *)&this->format,(string *)format);
  this->ndim = ndim;
  pvVar1 = pybind11::detail::any_container::operator_cast_to_vector__((any_container *)shape_in);
  std::vector<long,_std::allocator<long>_>::vector(&this->shape,pvVar1);
  pvVar1 = pybind11::detail::any_container::operator_cast_to_vector__((any_container *)strides_in);
  std::vector<long,_std::allocator<long>_>::vector(&this->strides,pvVar1);
  this->readonly = readonly;
  this->m_view = (Py_buffer *)0x0;
  this->ownview = false;
  sVar2 = std::vector<long,_std::allocator<long>_>::size(&this->shape);
  if (ndim == sVar2) {
    sVar2 = std::vector<long,_std::allocator<long>_>::size(&this->strides);
    if (ndim == sVar2) {
      for (local_58 = 0; local_58 < (ulong)ndim; local_58 = local_58 + 1) {
        pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](&this->shape,local_58);
        this->size = *pvVar3 * this->size;
      }
      return;
    }
  }
  pybind11_fail("buffer_info: ndim doesn\'t match shape and/or strides length");
}

Assistant:

buffer_info(void *ptr, ssize_t itemsize, const std::string &format, ssize_t ndim,
                detail::any_container<ssize_t> shape_in, detail::any_container<ssize_t> strides_in, bool readonly=false)
    : ptr(ptr), itemsize(itemsize), size(1), format(format), ndim(ndim),
      shape(std::move(shape_in)), strides(std::move(strides_in)), readonly(readonly) {
        if (ndim != (ssize_t) shape.size() || ndim != (ssize_t) strides.size())
            pybind11_fail("buffer_info: ndim doesn't match shape and/or strides length");
        for (size_t i = 0; i < (size_t) ndim; ++i)
            size *= shape[i];
    }